

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O1

void __thiscall QEvdevKeyboardHandler::readKeycode(QEvdevKeyboardHandler *this)

{
  QKeycodeAction QVar1;
  ssize_t sVar2;
  int *piVar3;
  QKeycodeAction QVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  long in_FS_OFFSET;
  input_event buffer [32];
  char local_358 [24];
  char *local_340;
  undefined1 local_338 [16];
  short asStack_328 [2];
  int aiStack_324 [187];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_338,0xaa,0x300);
  uVar6 = 0;
  do {
    iVar8 = (this->m_fd).m_fd;
    do {
      sVar2 = read(iVar8,local_338 + uVar6,0x300 - uVar6);
      if (sVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    iVar8 = (int)sVar2;
    if (iVar8 == 0) {
      local_358[0] = '\x02';
      local_358[1] = '\0';
      local_358[2] = '\0';
      local_358[3] = '\0';
      local_358[4] = '\0';
      local_358[5] = '\0';
      local_358[6] = '\0';
      local_358[7] = '\0';
      local_358[8] = '\0';
      local_358[9] = '\0';
      local_358[10] = '\0';
      local_358[0xb] = '\0';
      local_358[0xc] = '\0';
      local_358[0xd] = '\0';
      local_358[0xe] = '\0';
      local_358[0xf] = '\0';
      local_358[0x10] = '\0';
      local_358[0x11] = '\0';
      local_358[0x12] = '\0';
      local_358[0x13] = '\0';
      local_358[0x14] = '\0';
      local_358[0x15] = '\0';
      local_358[0x16] = '\0';
      local_358[0x17] = '\0';
      local_340 = "default";
      QMessageLogger::warning(local_358,"evdevkeyboard: Got EOF from the input device");
      cVar7 = '\x01';
    }
    else if (iVar8 < 0) {
      piVar3 = __errno_location();
      cVar7 = '\0';
      if ((*piVar3 != 4) && (cVar7 = '\0', *piVar3 != 0xb)) {
        qErrnoWarning("evdevkeyboard: Could not read from input device");
        cVar7 = '\x01';
        if (*piVar3 == 0x13) {
          if (this->m_notify != (QSocketNotifier *)0x0) {
            (**(code **)(*(long *)this->m_notify + 0x20))();
          }
          this->m_notify = (QSocketNotifier *)0x0;
          QFdContainer::reset(&this->m_fd);
        }
      }
    }
    else {
      uVar5 = (int)uVar6 + iVar8;
      uVar6 = (ulong)uVar5;
      cVar7 = ((uVar5 * -0x55555555 >> 3 | uVar5 * 0x60000000) < 0xaaaaaab) * '\x02';
    }
  } while (cVar7 == '\0');
  if ((cVar7 == '\x02') && (0x17 < (uint)uVar6)) {
    lVar9 = 0;
    do {
      if (*(short *)((long)asStack_328 + lVar9) == 1) {
        iVar8 = *(int *)((long)asStack_328 + lVar9 + 4);
        QVar1 = processKeycode(this,*(quint16 *)((long)asStack_328 + lVar9 + 2),iVar8 != 0,
                               iVar8 == 2);
        if (QVar1 - CapsLockOff < 2) {
          iVar8 = 1;
          QVar4 = CapsLockOn;
        }
        else if (QVar1 + 0xfd000000 < 2) {
          iVar8 = 2;
          QVar4 = ScrollLockOn;
        }
        else {
          if (1 < QVar1 + 0xfe000000) goto LAB_00126835;
          iVar8 = 0;
          QVar4 = NumLockOn;
        }
        switchLed(this,iVar8,QVar1 == QVar4);
      }
LAB_00126835:
      lVar9 = lVar9 + 0x18;
    } while ((ulong)((uint)(uVar6 / 3) & 0xfffffff8) * 3 != lVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevKeyboardHandler::readKeycode()
{
    struct ::input_event buffer[32];
    int n = 0;

    forever {
        int result = qt_safe_read(m_fd.get(), reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevkeyboard: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevkeyboard: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    m_fd.reset();
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }